

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcChain.c
# Opt level: O2

int Bmc_ChainTest(Gia_Man_t *p,int nFrameMax,int nConfMax,int fVerbose,int fVeryVerbose,
                 Vec_Ptr_t **pvCexes)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  Gia_Man_t *p_00;
  abctime aVar6;
  Vec_Ptr_t *pVVar7;
  void **ppvVar8;
  abctime aVar9;
  Abc_Cex_t *p_01;
  abctime aVar10;
  Gia_Man_t *p_02;
  abctime aVar11;
  Vec_Int_t *vOutputs;
  abctime aVar12;
  abctime aVar13;
  int iVar14;
  Vec_Int_t *pVVar15;
  ulong Time;
  Vec_Int_t *pVVar16;
  abctime time;
  abctime time_00;
  char *pcVar17;
  char *pStr;
  char *pStr_00;
  char *pStr_01;
  uint local_8c;
  uint local_84;
  char *local_78;
  
  pVVar15 = (Vec_Int_t *)(ulong)(uint)fVerbose;
  p_00 = Gia_ManDup(p);
  aVar6 = Abc_Clock();
  if (pvCexes != (Vec_Ptr_t **)0x0) {
    pVVar7 = (Vec_Ptr_t *)malloc(0x10);
    pVVar7->nCap = 1000;
    pVVar7->nSize = 0;
    ppvVar8 = (void **)malloc(8000);
    pVVar7->pArray = ppvVar8;
    *pvCexes = pVVar7;
  }
  pStr_01 = (char *)0x0;
  local_78 = (char *)0x0;
  pStr_00 = (char *)0x0;
  pStr = (char *)0x0;
  local_84 = 0;
  local_8c = 0;
  do {
    iVar14 = (int)pVVar15;
    if (local_8c == 10000) {
LAB_0048d6ff:
      iVar14 = p_00->vCos->nSize;
      iVar3 = p_00->nRegs;
      iVar5 = Gia_ManCountNonConst0(p_00);
      pcVar17 = (char *)(ulong)local_8c;
      Time = (ulong)(uint)(iVar14 - (iVar5 + iVar3));
      printf("Completed a CEX chain with %d segments, %d frames, and %d failed POs (out of %d). ",
             pcVar17,(ulong)local_84,Time,(ulong)(uint)(p_00->vCos->nSize - p_00->nRegs));
      if (fVerbose != 0) {
        aVar9 = Abc_Clock();
        Abc_PrintTime((int)aVar9 - (int)aVar6,pcVar17,time_00);
        aVar9 = Abc_Clock();
        Abc_PrintTimeP(0x810cf4,pStr_01,aVar9 - aVar6,Time);
        aVar9 = Abc_Clock();
        Abc_PrintTimeP(0x810cfa,local_78,aVar9 - aVar6,Time);
        aVar9 = Abc_Clock();
        Abc_PrintTimeP(0x823d25,pStr_00,aVar9 - aVar6,Time);
        aVar9 = Abc_Clock();
        Abc_PrintTimeP(0x810d00,pStr,aVar9 - aVar6,Time);
      }
      Gia_ManStop(p_00);
      if (pvCexes != (Vec_Ptr_t **)0x0) {
        printf("Total number of CEXes collected = %d.\n",(ulong)(uint)(*pvCexes)->nSize);
      }
      return 0;
    }
    if (p_00->vCos->nSize == p_00->nRegs) {
      if (fVerbose != 0) {
        puts("Finished all POs.");
      }
      goto LAB_0048d6ff;
    }
    aVar9 = Abc_Clock();
    p_01 = Bmc_ChainFailOneOutput(p_00,nFrameMax,nConfMax,iVar14,fVeryVerbose);
    aVar10 = Abc_Clock();
    pStr_01 = pStr_01 + (aVar10 - aVar9);
    if (p_01 == (Abc_Cex_t *)0x0) {
      if (fVerbose != 0) {
        printf("BMC could not detect a failed output in %d frames with %d conflicts.\n",
               (ulong)(uint)nFrameMax,(ulong)(uint)nConfMax);
      }
      goto LAB_0048d6ff;
    }
    if ((local_8c != 0) && (p_01->iFrame < 1)) {
      __assert_fail("!Iter || pCex->iFrame > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcChain.c"
                    ,0x14c,"int Bmc_ChainTest(Gia_Man_t *, int, int, int, int, Vec_Ptr_t **)");
    }
    aVar9 = Abc_Clock();
    p_02 = Gia_ManVerifyCexAndMove(p_00,p_01);
    Gia_ManStop(p_00);
    local_84 = local_84 + p_01->iFrame;
    aVar10 = Abc_Clock();
    aVar11 = Abc_Clock();
    if (pvCexes == (Vec_Ptr_t **)0x0) {
      pVVar7 = (Vec_Ptr_t *)0x0;
    }
    else {
      pVVar7 = *pvCexes;
    }
    local_78 = local_78 + (aVar10 - aVar9);
    vOutputs = Bmc_ChainFindFailedOutputs(p_02,pVVar7);
    uVar2 = vOutputs->nSize;
    pVVar15 = (Vec_Int_t *)0x0;
    if (0 < (int)uVar2) {
      pVVar15 = (Vec_Int_t *)(ulong)uVar2;
    }
    pVVar16 = (Vec_Int_t *)0x0;
    do {
      if (pVVar15 == pVVar16) {
        __assert_fail("Vec_IntFind(vOutputs, pCex->iPo) >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcChain.c"
                      ,0x156,"int Bmc_ChainTest(Gia_Man_t *, int, int, int, int, Vec_Ptr_t **)");
      }
      piVar1 = vOutputs->pArray + (long)pVVar16;
      pVVar16 = (Vec_Int_t *)((long)&pVVar16->nCap + 1);
    } while (*piVar1 != p_01->iPo);
    if (pvCexes == (Vec_Ptr_t **)0x0) {
      Abc_CexFree(p_01);
    }
    else {
      Vec_PtrPush(*pvCexes,p_01);
    }
    aVar9 = Abc_Clock();
    aVar10 = Abc_Clock();
    p_00 = Bmc_ChainCleanup(p_02,vOutputs);
    Gia_ManStop(p_02);
    aVar12 = Abc_Clock();
    Abc_Clock();
    Abc_Clock();
    if (fVerbose != 0) {
      uVar4 = Gia_ManCountNonConst0(p_00);
      printf("Iter %4d : ");
      printf("Depth =%5d  ",(ulong)local_84);
      printf("FailPo =%5d  ",(ulong)uVar2);
      printf("UndecPo =%5d ",(ulong)uVar4);
      printf("(%6.2f %%)  ",((double)(int)uVar4 * 100.0) / (double)(p_00->vCos->nSize - p_00->nRegs)
            );
      pVVar15 = p_00->vCos;
      pcVar17 = (char *)(ulong)(uint)(~(pVVar15->nSize + p_00->vCis->nSize) + p_00->nObjs);
      printf("AIG =%8d  ");
      aVar13 = Abc_Clock();
      Abc_PrintTime((int)aVar13 - (int)aVar6,pcVar17,time);
    }
    local_8c = local_8c + 1;
    pStr_00 = pStr_00 + (aVar9 - aVar11);
    pStr = pStr + (aVar12 - aVar10);
    Vec_IntFree(vOutputs);
  } while( true );
}

Assistant:

int Bmc_ChainTest( Gia_Man_t * p, int nFrameMax, int nConfMax, int fVerbose, int fVeryVerbose, Vec_Ptr_t ** pvCexes )
{
    int Iter, IterMax = 10000;
    Gia_Man_t * pTemp, * pNew = Gia_ManDup(p);
    Abc_Cex_t * pCex = NULL;
    Vec_Int_t * vOutputs;
    abctime clk2, clk = Abc_Clock(); 
    abctime clkBmc = 0;
    abctime clkMov = 0;
    abctime clkSat = 0;
    abctime clkCln = 0;
    abctime clkSwp = 0;
    int DepthTotal = 0;
    if ( pvCexes )
        *pvCexes = Vec_PtrAlloc( 1000 );
    for ( Iter = 0; Iter < IterMax; Iter++ )
    {
        if ( Gia_ManPoNum(pNew) == 0 )
        {
            if ( fVerbose )
                printf( "Finished all POs.\n" );
            break;
        }
        // run BMC till the first failure
        clk2 = Abc_Clock(); 
        pCex = Bmc_ChainFailOneOutput( pNew, nFrameMax, nConfMax, fVerbose, fVeryVerbose );
        clkBmc += Abc_Clock() - clk2;
        if ( pCex == NULL )
        {
            if ( fVerbose )
                printf( "BMC could not detect a failed output in %d frames with %d conflicts.\n", nFrameMax, nConfMax );
            break;
        }
        assert( !Iter || pCex->iFrame > 0 );
        // move the AIG to the failure state
        clk2 = Abc_Clock(); 
        pNew = Gia_ManVerifyCexAndMove( pTemp = pNew, pCex );
        Gia_ManStop( pTemp );
        DepthTotal += pCex->iFrame;
        clkMov += Abc_Clock() - clk2;
        // find outputs that fail in this state
        clk2 = Abc_Clock(); 
        vOutputs = Bmc_ChainFindFailedOutputs( pNew, pvCexes ? *pvCexes : NULL );
        assert( Vec_IntFind(vOutputs, pCex->iPo) >= 0 );
        // save the counter-example
        if ( pvCexes )
            Vec_PtrPush( *pvCexes, pCex );
        else
            Abc_CexFree( pCex );
        clkSat += Abc_Clock() - clk2;
        // remove them from the AIG 
        clk2 = Abc_Clock(); 
        pNew = Bmc_ChainCleanup( pTemp = pNew, vOutputs );
        Gia_ManStop( pTemp );
        clkCln += Abc_Clock() - clk2;
        // perform sequential cleanup
        clk2 = Abc_Clock(); 
//        pNew = Gia_ManSeqStructSweep( pTemp = pNew, 0, 1, 0 );
//        Gia_ManStop( pTemp );
        clkSwp += Abc_Clock() - clk2;
        // printout
        if ( fVerbose )
        {
            int nNonConst = Gia_ManCountNonConst0(pNew);
            printf( "Iter %4d : ",    Iter+1 );
            printf( "Depth =%5d  ",   DepthTotal );
            printf( "FailPo =%5d  ",  Vec_IntSize(vOutputs) );
            printf( "UndecPo =%5d ",  nNonConst );
            printf( "(%6.2f %%)  ",   100.0 * nNonConst / Gia_ManPoNum(pNew) );
            printf( "AIG =%8d  ",     Gia_ManAndNum(pNew) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
        Vec_IntFree( vOutputs );
    }
    printf( "Completed a CEX chain with %d segments, %d frames, and %d failed POs (out of %d). ", 
        Iter, DepthTotal, Gia_ManPoNum(pNew) - Gia_ManCountNonConst0(pNew), Gia_ManPoNum(pNew) );
    if ( fVerbose )
    {
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    Abc_PrintTimeP( 1, "BMC  ", clkBmc, Abc_Clock() - clk );
    Abc_PrintTimeP( 1, "Init ", clkMov, Abc_Clock() - clk );
    Abc_PrintTimeP( 1, "SAT  ", clkSat, Abc_Clock() - clk );
    Abc_PrintTimeP( 1, "Clean", clkCln, Abc_Clock() - clk );
//    Abc_PrintTimeP( 1, "Sweep", clkSwp, Abc_Clock() - clk );
    }
    Gia_ManStop( pNew );
    if ( pvCexes )
        printf( "Total number of CEXes collected = %d.\n", Vec_PtrSize(*pvCexes) );
    return 0;
}